

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::RegisterMulticastListener
          (Error *__return_storage_ptr__,CommissionerApp *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,Seconds aTimeout)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  ulong uVar5;
  Error *aError;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  anon_class_1_0_00000001 local_28a;
  v10 local_289;
  v10 *local_288;
  char *local_280;
  string local_278;
  Error local_258;
  undefined4 local_22c;
  Error local_228;
  anon_class_1_0_00000001 local_1fa;
  v10 local_1f9;
  v10 *local_1f8;
  size_t local_1f0;
  string local_1e8;
  Error local_1c8;
  undefined1 local_18a [8];
  uint8_t status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *aMulticastAddrList_local;
  CommissionerApp *this_local;
  Seconds aTimeout_local;
  Error *error;
  undefined1 local_150 [16];
  v10 *local_140;
  ulong local_138;
  v10 *local_130;
  size_t sStack_128;
  string *local_120;
  v10 *local_118;
  v10 **local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_108 [3];
  undefined1 local_f0 [16];
  v10 *local_e0;
  char *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_d0;
  v10 *local_c8;
  char *pcStack_c0;
  string *local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  Error **local_80;
  undefined1 *local_78;
  Error **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_10;
  
  local_18a[1] = 0;
  unique0x100003ae = aMulticastAddrList;
  aMulticastAddrList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (CommissionerApp *)aTimeout.__r;
  aTimeout_local.__r = (rep)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar3 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar3 & 1) == 0) {
    RegisterMulticastListener::anon_class_1_0_00000001::operator()(&local_1fa);
    local_110 = &local_1f8;
    local_118 = &local_1f9;
    bVar6 = ::fmt::v10::operator()(local_118);
    local_1f0 = bVar6.size_;
    local_1f8 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_120 = &local_1e8;
    local_130 = local_1f8;
    sStack_128 = local_1f0;
    local_a0 = &local_130;
    local_140 = local_1f8;
    local_138 = local_1f0;
    local_98 = local_140;
    sStack_90 = local_138;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_78 = local_150;
    local_80 = &error;
    local_60 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_80;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_138;
    local_70 = local_80;
    local_68 = local_80;
    local_58 = local_78;
    ::fmt::v10::vformat_abi_cxx11_(&local_1e8,local_140,fmt,args);
    Error::Error(&local_1c8,kInvalidState,&local_1e8);
    Error::operator=(__return_storage_ptr__,&local_1c8);
    Error::~Error(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    uVar1 = stack0xfffffffffffffe78;
    uVar5 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                      ((duration<long,_std::ratio<1L,_1L>_> *)&this_local);
    (*peVar4->_vptr_Commissioner[0x32])(&local_228,peVar4,local_18a,uVar1,uVar5 & 0xffffffff);
    aError = Error::operator=(__return_storage_ptr__,&local_228);
    local_22c = 0;
    this_00 = (v10 *)&local_22c;
    bVar2 = commissioner::operator!=(aError,(ErrorCode *)this_00);
    Error::~Error(&local_228);
    if ((!bVar2) && ((bool)local_18a[0] != false)) {
      RegisterMulticastListener::anon_class_1_0_00000001::operator()(&local_28a);
      local_a8 = &local_288;
      local_b0 = &local_289;
      bVar6 = ::fmt::v10::operator()(local_b0);
      local_280 = (char *)bVar6.size_;
      local_288 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<unsigned_char_&,_FMT_COMPILE_STRING,_0>();
      local_b8 = &local_278;
      local_c8 = local_288;
      pcStack_c0 = local_280;
      local_d0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
                  *)local_18a;
      local_50 = &local_c8;
      local_e0 = local_288;
      local_d8 = local_280;
      local_48 = local_e0;
      pcStack_40 = local_d8;
      local_108[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char>
                               (local_d0,this_00,(uchar *)local_b8);
      local_30 = local_f0;
      local_38 = local_108;
      local_20 = 2;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_38;
      fmt_00.size_ = 2;
      fmt_00.data_ = local_d8;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_278,local_e0,fmt_00,args_00);
      Error::Error(&local_258,kRejected,&local_278);
      Error::operator=(__return_storage_ptr__,&local_258);
      Error::~Error(&local_258);
      std::__cxx11::string::~string((string *)&local_278);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::RegisterMulticastListener(const std::vector<std::string> &aMulticastAddrList, Seconds aTimeout)
{
    Error   error;
    uint8_t status;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->RegisterMulticastListener(status, aMulticastAddrList, aTimeout.count()));
    VerifyOrExit(status == kMlrStatusSuccess,
                 error = ERROR_REJECTED("request was rejected with statusCode={}", status));

exit:
    return error;
}